

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset,
              int depth)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t encoded_04;
  amqp_bytes_t encoded_05;
  amqp_bytes_t encoded_06;
  amqp_bytes_t encoded_07;
  amqp_bytes_t encoded_08;
  amqp_bytes_t encoded_09;
  amqp_bytes_t encoded_10;
  amqp_bytes_t encoded_11;
  amqp_bytes_t encoded_12;
  amqp_bytes_t encoded_13;
  amqp_bytes_t encoded_14;
  amqp_bytes_t encoded_15;
  amqp_bytes_t encoded_16;
  amqp_bytes_t encoded_17;
  amqp_bytes_t encoded_18;
  int iVar1;
  int iVar2;
  size_t *in_RCX;
  ulong len_00;
  amqp_table_t *in_RDX;
  undefined8 in_RSI;
  amqp_pool_t *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  uint32_t len;
  uint64_t val_4;
  uint32_t val_3;
  uint16_t val_2;
  uint8_t val_1;
  uint8_t val;
  int res;
  amqp_bytes_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  char in_stack_ffffffffffffffc7;
  int iVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int)((ulong)in_R8 >> 0x20);
  iVar3 = -2;
  if (100 < in_R9D) {
    return -2;
  }
  encoded_00.len._4_2_ = in_stack_ffffffffffffffc4;
  encoded_00.len._0_4_ = in_stack_ffffffffffffffc0;
  encoded_00.len._6_1_ = in_stack_ffffffffffffffc6;
  encoded_00.len._7_1_ = in_stack_ffffffffffffffc7;
  encoded_00.bytes._0_4_ = 0xfffffffe;
  encoded_00.bytes._4_4_ = in_R9D;
  iVar1 = amqp_decode_8(encoded_00,in_stack_ffffffffffffffb8,(uint8_t *)in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    return iVar3;
  }
  len_00 = (ulong)((byte)*in_RCX - 0x41);
  switch(len_00) {
  case 0:
    encoded_17.bytes._0_4_ = in_stack_fffffffffffffff8;
    encoded_17.len = in_RSI;
    encoded_17.bytes._4_4_ = in_stack_fffffffffffffffc;
    iVar3 = amqp_decode_array(encoded_17,in_RDI,(amqp_array_t *)in_RDX,in_RCX,iVar2);
    return iVar3;
  case 1:
    encoded_03.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_03.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_03.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_03.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_03.bytes._0_4_ = iVar3;
    encoded_03.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_8(encoded_03,in_stack_ffffffffffffffb8,(uint8_t *)in_stack_ffffffffffffffb0)
    ;
    break;
  default:
    return iVar3;
  case 3:
    encoded_12.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_12.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_12.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_12.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_12.bytes._0_4_ = iVar3;
    encoded_12.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_8(encoded_12,in_stack_ffffffffffffffb8,(uint8_t *)in_stack_ffffffffffffffb0)
    ;
    if (iVar2 == 0) {
      return iVar3;
    }
    encoded_13.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_13.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_13.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_13.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_13.bytes._0_4_ = iVar3;
    encoded_13.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_32(encoded_13,in_stack_ffffffffffffffb8,
                           (uint32_t *)in_stack_ffffffffffffffb0);
    break;
  case 5:
    encoded_18.bytes._0_4_ = in_stack_fffffffffffffff8;
    encoded_18.len = in_RSI;
    encoded_18.bytes._4_4_ = in_stack_fffffffffffffffc;
    iVar3 = amqp_decode_table_internal(encoded_18,in_RDI,in_RDX,in_RCX,iVar2);
    return iVar3;
  case 8:
    encoded_06.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_06.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_06.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_06.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_06.bytes._0_4_ = iVar3;
    encoded_06.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_32(encoded_06,in_stack_ffffffffffffffb8,
                           (uint32_t *)in_stack_ffffffffffffffb0);
    if (iVar2 == 0) {
      return iVar3;
    }
    *(undefined4 *)(in_RCX + 1) = in_stack_ffffffffffffffc0;
    goto LAB_0011698c;
  case 0xb:
    encoded_09.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_09.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_09.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_09.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_09.bytes._0_4_ = iVar3;
    encoded_09.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_64(encoded_09,in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->len);
    break;
  case 0x12:
  case 0x37:
    encoded_14.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_14.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_14.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_14.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_14.bytes._0_4_ = iVar3;
    encoded_14.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_32(encoded_14,in_stack_ffffffffffffffb8,
                           (uint32_t *)in_stack_ffffffffffffffb0);
    if (iVar2 == 0) {
      return iVar3;
    }
    encoded_15.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_15.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_15.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_15.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_15.bytes._0_4_ = iVar3;
    encoded_15.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_bytes(encoded_15,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,len_00)
    ;
    break;
  case 0x13:
    encoded_16.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_16.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_16.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_16.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_16.bytes._0_4_ = iVar3;
    encoded_16.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_64(encoded_16,in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->len);
    break;
  case 0x15:
    goto LAB_0011698c;
  case 0x21:
    encoded_02.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_02.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_02.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_02.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_02.bytes._0_4_ = iVar3;
    encoded_02.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_8(encoded_02,in_stack_ffffffffffffffb8,(uint8_t *)in_stack_ffffffffffffffb0)
    ;
    if (iVar2 == 0) {
      return iVar3;
    }
    *(undefined1 *)(in_RCX + 1) = in_stack_ffffffffffffffc6;
    goto LAB_0011698c;
  case 0x23:
    encoded_11.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_11.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_11.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_11.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_11.bytes._0_4_ = iVar3;
    encoded_11.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_64(encoded_11,in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->len);
    break;
  case 0x25:
    encoded_10.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_10.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_10.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_10.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_10.bytes._0_4_ = iVar3;
    encoded_10.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_32(encoded_10,in_stack_ffffffffffffffb8,
                           (uint32_t *)in_stack_ffffffffffffffb0);
    break;
  case 0x28:
    encoded_07.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_07.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_07.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_07.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_07.bytes._0_4_ = iVar3;
    encoded_07.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_32(encoded_07,in_stack_ffffffffffffffb8,
                           (uint32_t *)in_stack_ffffffffffffffb0);
    break;
  case 0x2b:
    encoded_08.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_08.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_08.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_08.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_08.bytes._0_4_ = iVar3;
    encoded_08.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_64(encoded_08,in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->len);
    if (iVar2 == 0) {
      return iVar3;
    }
    in_RCX[1] = (size_t)in_stack_ffffffffffffffb8;
    goto LAB_0011698c;
  case 0x32:
    encoded_04.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_04.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_04.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_04.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_04.bytes._0_4_ = iVar3;
    encoded_04.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_16(encoded_04,in_stack_ffffffffffffffb8,
                           (uint16_t *)in_stack_ffffffffffffffb0);
    if (iVar2 == 0) {
      return iVar3;
    }
    *(undefined2 *)(in_RCX + 1) = in_stack_ffffffffffffffc4;
    goto LAB_0011698c;
  case 0x33:
    encoded_01.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_01.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_01.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_01.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_01.bytes._0_4_ = iVar3;
    encoded_01.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_8(encoded_01,in_stack_ffffffffffffffb8,(uint8_t *)in_stack_ffffffffffffffb0)
    ;
    if (iVar2 == 0) {
      return iVar3;
    }
    *(uint *)(in_RCX + 1) = (uint)(in_stack_ffffffffffffffc7 != '\0');
    goto LAB_0011698c;
  case 0x34:
    encoded_05.len._4_2_ = in_stack_ffffffffffffffc4;
    encoded_05.len._0_4_ = in_stack_ffffffffffffffc0;
    encoded_05.len._6_1_ = in_stack_ffffffffffffffc6;
    encoded_05.len._7_1_ = in_stack_ffffffffffffffc7;
    encoded_05.bytes._0_4_ = iVar3;
    encoded_05.bytes._4_4_ = in_R9D;
    iVar2 = amqp_decode_16(encoded_05,in_stack_ffffffffffffffb8,
                           (uint16_t *)in_stack_ffffffffffffffb0);
  }
  if (iVar2 != 0) {
LAB_0011698c:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded, amqp_pool_t *pool,
                                   amqp_field_value_t *entry, size_t *offset,
                                   int depth) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (depth > TABLE_DEPTH_LIMIT) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits)                                          \
  if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; \
  break
#define SIMPLE_FIELD_DECODER(bits, dest, how)                 \
  {                                                           \
    uint##bits##_t val;                                       \
    if (!amqp_decode_##bits(encoded, offset, &val)) goto out; \
    entry->value.dest = how;                                  \
  }                                                           \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
    case AMQP_FIELD_KIND_U8:
      TRIVIAL_FIELD_DECODER(8);

    case AMQP_FIELD_KIND_I16:
      SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
    case AMQP_FIELD_KIND_U16:
      TRIVIAL_FIELD_DECODER(16);

    case AMQP_FIELD_KIND_I32:
      SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
    case AMQP_FIELD_KIND_U32:
      TRIVIAL_FIELD_DECODER(32);

    case AMQP_FIELD_KIND_I64:
      SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
    case AMQP_FIELD_KIND_U64:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_F32:
      TRIVIAL_FIELD_DECODER(32);
      /* and by punning, f32 magically gets the right value...! */

    case AMQP_FIELD_KIND_F64:
      TRIVIAL_FIELD_DECODER(64);
      /* and by punning, f64 magically gets the right value...! */

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals) ||
          !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES: {
      uint32_t len;
      if (!amqp_decode_32(encoded, offset, &len) ||
          !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
        goto out;
      }
      break;
    }

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_decode_array(encoded, pool, &(entry->value.array), offset,
                              depth + 1);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_decode_table_internal(encoded, pool, &(entry->value.table),
                                       offset, depth + 1);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}